

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

uint16_t *
ot::commissioner::CommissionerApp::GetJoinerUdpPort
          (CommissionerDataset *aDataset,JoinerType aJoinerType)

{
  if (aJoinerType < (kNMKP|kAE)) {
    aDataset->mPresentFlags =
         aDataset->mPresentFlags | (ushort)(0x10002000400 >> ((byte)(aJoinerType << 4) & 0x3f));
    return &aDataset->mJoinerUdpPort + aJoinerType;
  }
  abort();
}

Assistant:

uint16_t &CommissionerApp::GetJoinerUdpPort(CommissionerDataset &aDataset, JoinerType aJoinerType)
{
    switch (aJoinerType)
    {
    case JoinerType::kMeshCoP:
        aDataset.mPresentFlags |= CommissionerDataset::kJoinerUdpPortBit;
        return aDataset.mJoinerUdpPort;

    case JoinerType::kAE:
        aDataset.mPresentFlags |= CommissionerDataset::kAeUdpPortBit;
        return aDataset.mAeUdpPort;

    case JoinerType::kNMKP:
        aDataset.mPresentFlags |= CommissionerDataset::kNmkpUdpPortBit;
        return aDataset.mNmkpUdpPort;

    default:
        VerifyOrDie(false);
        aDataset.mPresentFlags |= CommissionerDataset::kJoinerUdpPortBit;
        return aDataset.mJoinerUdpPort;
    }
}